

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O0

void __thiscall OSSLRSAPrivateKey::createOSSLKey(OSSLRSAPrivateKey *this)

{
  RSA *pRVar1;
  RSA_METHOD *meth;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  BIGNUM *pBVar9;
  long in_RDI;
  BIGNUM *bn_d;
  BIGNUM *bn_e;
  BIGNUM *bn_n;
  BIGNUM *bn_iqmp;
  BIGNUM *bn_dmq1;
  BIGNUM *bn_dmp1;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  
  if (*(long *)(in_RDI + 0x148) == 0) {
    pRVar1 = RSA_new();
    *(RSA **)(in_RDI + 0x148) = pRVar1;
    if (*(long *)(in_RDI + 0x148) == 0) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSAPrivateKey.cpp"
                 ,0x11f,"Could not create RSA object");
    }
    else {
      pRVar1 = *(RSA **)(in_RDI + 0x148);
      meth = (RSA_METHOD *)RSA_PKCS1_OpenSSL();
      RSA_set_method(pRVar1,meth);
      pBVar2 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar3 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar4 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar5 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar6 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar7 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar8 = OSSL::byteString2bn((ByteString *)pRVar1);
      pBVar9 = OSSL::byteString2bn((ByteString *)pRVar1);
      RSA_set0_factors(*(undefined8 *)(in_RDI + 0x148),pBVar2,pBVar3);
      RSA_set0_crt_params(*(undefined8 *)(in_RDI + 0x148),pBVar4,pBVar5,pBVar6);
      RSA_set0_key(*(undefined8 *)(in_RDI + 0x148),pBVar7,pBVar8,pBVar9);
    }
  }
  return;
}

Assistant:

void OSSLRSAPrivateKey::createOSSLKey()
{
	if (rsa != NULL) return;

	rsa = RSA_new();
	if (rsa == NULL)
	{
		ERROR_MSG("Could not create RSA object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		RSA_set_method(rsa, FIPS_rsa_pkcs1_ssleay());
	else
		RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#else
	RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#endif

#else
	RSA_set_method(rsa, RSA_PKCS1_OpenSSL());
#endif

	BIGNUM* bn_p = OSSL::byteString2bn(p);
	BIGNUM* bn_q = OSSL::byteString2bn(q);
	BIGNUM* bn_dmp1 = OSSL::byteString2bn(dp1);
	BIGNUM* bn_dmq1 = OSSL::byteString2bn(dq1);
	BIGNUM* bn_iqmp = OSSL::byteString2bn(pq);
	BIGNUM* bn_n = OSSL::byteString2bn(n);
	BIGNUM* bn_e = OSSL::byteString2bn(e);
	BIGNUM* bn_d = OSSL::byteString2bn(d);

	RSA_set0_factors(rsa, bn_p, bn_q);
	RSA_set0_crt_params(rsa, bn_dmp1, bn_dmq1, bn_iqmp);
	RSA_set0_key(rsa, bn_n, bn_e, bn_d);
}